

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_property(nk_context *ctx,char *name,nk_property_variant *variant,float inc_per_pixel,
                nk_property_filter filter)

{
  nk_command_buffer *b;
  nk_flags *state;
  nk_property nVar1;
  byte bVar2;
  nk_hash seed;
  nk_property_kind nVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  nk_plugin_filter filter_00;
  double dVar7;
  double dVar8;
  nk_plugin_paste p_Var9;
  long lVar10;
  int *piVar11;
  undefined1 auVar12 [16];
  int *piVar13;
  int *piVar14;
  nk_button_behavior behavior;
  nk_widget_layout_states nVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  nk_context *in;
  char *pcVar19;
  uint uVar20;
  int *piVar21;
  nk_context *pnVar22;
  ulong uVar23;
  int *piVar24;
  nk_user_font *pnVar25;
  nk_style_property *pnVar26;
  bool bVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect b_00;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect bounds_02;
  int num_len;
  int dummy_select_end;
  int dummy_select_begin;
  int dummy_cursor;
  int dummy_length;
  int dummy_state;
  nk_rect bounds;
  char dummy_buffer [64];
  char *local_270;
  int local_25c;
  nk_user_font *local_258;
  int local_24c;
  undefined8 local_248;
  float fStack_240;
  float fStack_23c;
  int *local_238;
  int *local_230;
  nk_rect local_228;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  int *local_1f8;
  int *local_1f0;
  nk_hash local_1e8;
  float local_1e4;
  float local_1e0;
  int local_1dc;
  nk_button_behavior local_1d8;
  nk_property_filter local_1d4;
  int local_1d0;
  int local_1cc [5];
  undefined8 local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  undefined4 uStack_190;
  float fStack_18c;
  char *local_180;
  nk_text local_178;
  float local_168;
  float fStack_164;
  undefined8 uStack_160;
  undefined1 local_158 [8];
  undefined4 uStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  nk_context *local_128;
  nk_window *local_120;
  float local_118;
  float fStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  undefined4 uStack_e0;
  float fStack_dc;
  nk_rect local_d8;
  char local_c8 [64];
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  char local_78 [72];
  
  local_1cc[4] = 0;
  local_1cc[3] = 0;
  local_1cc[2] = 0;
  local_1cc[1] = 0;
  local_1cc[0] = 0;
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5c54,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  pnVar5 = pnVar4->layout;
  local_1e4 = inc_per_pixel;
  if (pnVar5 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5c55,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  nVar15 = nk_widget(&local_d8,ctx);
  if (nVar15 == NK_WIDGET_INVALID) {
    return;
  }
  bVar2 = *name;
  uVar23 = (ulong)bVar2;
  local_1d4 = filter;
  if (bVar2 == 0) {
LAB_0013c78e:
    local_1e8 = nk_murmur_hash(name,(int)uVar23,0x2a);
  }
  else {
    if (bVar2 != 0x23) {
      uVar23 = 0;
      do {
        lVar18 = uVar23 + 1;
        uVar23 = uVar23 + 1;
      } while (name[lVar18] != '\0');
      goto LAB_0013c78e;
    }
    lVar18 = 0;
    do {
      lVar10 = lVar18 + 1;
      lVar18 = lVar18 + 1;
    } while (name[lVar10] != '\0');
    seed = (pnVar4->property).seq;
    (pnVar4->property).seq = seed + 1;
    local_1e8 = nk_murmur_hash(name,(int)lVar18,seed);
    name = name + 1;
  }
  local_1f0 = local_1cc;
  local_1f8 = local_1cc + 1;
  local_230 = local_1cc + 2;
  piVar24 = local_1cc + 3;
  local_270 = local_78;
  piVar21 = local_1cc + 4;
  if (((pnVar4->property).active != 0) && (local_1e8 == (pnVar4->property).name)) {
    local_270 = (pnVar4->property).buffer;
    piVar24 = &(pnVar4->property).length;
    local_230 = &(pnVar4->property).cursor;
    piVar21 = &(pnVar4->property).state;
    local_1f8 = &(pnVar4->property).select_start;
    local_1f0 = &(pnVar4->property).select_end;
  }
  local_1d0 = *piVar21;
  (ctx->text_edit).clip.copy = (ctx->clip).copy;
  p_Var9 = (ctx->clip).paste;
  (ctx->text_edit).clip.userdata = (ctx->clip).userdata;
  (ctx->text_edit).clip.paste = p_Var9;
  if ((nVar15 == NK_WIDGET_ROM) && ((pnVar4->property).active == 0)) {
    pnVar22 = (nk_context *)0x0;
  }
  else {
    pnVar22 = (nk_context *)0x0;
    if ((pnVar5->flags & 0x1000) == 0) {
      pnVar22 = ctx;
    }
  }
  pnVar25 = (ctx->style).font;
  local_1d8 = ctx->button_behavior;
  fStack_240 = local_d8.y;
  local_208 = local_d8.h;
  local_168 = local_d8.w;
  fStack_164 = local_d8.h;
  uStack_160 = 0;
  local_228.x = local_d8.x;
  local_228.y = local_d8.y;
  local_228.w = 0.0;
  local_228.h = 0.0;
  local_218 = ZEXT416((uint)(pnVar25->height * 0.5));
  local_1e0 = (ctx->style).property.border;
  local_148 = CONCAT44(fStack_240,local_d8.x + local_1e0 + (ctx->style).property.padding.x);
  uStack_140 = 0;
  fStack_23c = fStack_240;
  fStack_204 = local_208;
  fStack_200 = local_208;
  fStack_1fc = local_208;
  local_248._0_4_ = fStack_240;
  local_248._4_4_ = fStack_240;
  local_1dc = nk_strlen(name);
  fVar29 = (*pnVar25->width)(pnVar25->userdata,pnVar25->height,name,local_1dc);
  fVar30 = (ctx->style).property.border;
  fVar31 = (ctx->style).property.padding.x;
  local_198 = (float)local_218._0_4_ + (float)local_148 + fVar31;
  fStack_194 = (float)local_218._4_4_;
  uStack_190 = (float)local_218._8_4_;
  fStack_18c = (float)local_218._12_4_;
  _local_158 = ZEXT416((uint)(fVar31 + fVar31 + fVar29));
  local_1a8 = (float)local_248 + fVar30;
  fStack_1a4 = local_248._4_4_;
  fStack_1a0 = fStack_240;
  fStack_19c = fStack_23c;
  fVar29 = (ctx->style).property.padding.y;
  local_1b8 = (int *)CONCAT44(local_1b8._4_4_,fVar29);
  local_138 = (local_228.x + local_168) - ((float)local_218._0_4_ + fVar31);
  fStack_134 = local_228.y;
  fStack_130 = local_228.w;
  fStack_12c = local_228.h;
  local_118 = local_228.x + local_168;
  fStack_114 = local_228.y;
  uStack_110 = local_228.w;
  uStack_10c = local_228.h;
  local_258 = pnVar25;
  if (*piVar21 != 1) {
    nVar3 = variant->kind;
    if (nVar3 == NK_PROPERTY_DOUBLE) {
      nk_dtoa(local_c8,(variant->value).d);
      lVar18 = 0;
      iVar16 = 0;
      do {
        iVar17 = 1;
        if (local_c8[lVar18] != '.') {
          if (local_c8[lVar18] == '\0') goto LAB_0013cb22;
          if (iVar16 == 3) goto LAB_0013cb11;
          iVar17 = (uint)(0 < iVar16) + iVar16;
        }
        lVar18 = lVar18 + 1;
        iVar16 = iVar17;
      } while( true );
    }
    if (nVar3 == NK_PROPERTY_FLOAT) {
      nk_dtoa(local_c8,(double)(variant->value).f);
      lVar18 = 0;
      iVar16 = 0;
      do {
        iVar17 = 1;
        if (local_c8[lVar18] != '.') {
          if (local_c8[lVar18] == '\0') goto LAB_0013cb22;
          if (iVar16 == 3) goto LAB_0013cb11;
          iVar17 = (uint)(0 < iVar16) + iVar16;
        }
        lVar18 = lVar18 + 1;
        iVar16 = iVar17;
      } while( true );
    }
    if (nVar3 == NK_PROPERTY_INT) {
      nk_itoa(local_c8,(long)(variant->value).i);
      pnVar25 = local_258;
      if (local_c8[0] == '\0') {
        lVar18 = 0;
      }
      else {
        lVar18 = 0;
        do {
          lVar10 = lVar18 + 1;
          lVar18 = lVar18 + 1;
        } while (local_c8[lVar10] != '\0');
      }
      goto LAB_0013cb22;
    }
    goto LAB_0013cb26;
  }
  local_e8 = (*pnVar25->width)(pnVar25->userdata,pnVar25->height,local_270,*piVar24);
  local_e8 = local_e8 + (ctx->style).property.edit.cursor_size;
  local_180 = local_270;
  pnVar25 = local_258;
  local_238 = piVar24;
LAB_0013cb4f:
  local_1a8 = local_1a8 + (float)local_1b8;
  local_108 = local_208 - (fVar30 + fVar30 + fVar29 + fVar29);
  fStack_104 = fStack_204;
  fStack_100 = fStack_200;
  fStack_fc = fStack_1fc;
  state = &ctx->last_widget_state;
  fVar30 = (ctx->style).property.border;
  fVar31 = (ctx->style).property.padding.x;
  local_e8 = fVar31 + fVar31 + local_e8;
  fVar29 = local_138 - (local_198 + (float)local_158._0_4_);
  if (fVar29 <= local_e8) {
    local_e8 = fVar29;
  }
  local_f8 = local_138 - (fVar31 + local_e8);
  fStack_f4 = (float)local_248 + fVar30;
  fStack_f0 = fStack_134;
  fStack_ec = local_248._4_4_;
  fStack_e4 = local_208 - (fVar30 + fVar30);
  uStack_e0 = 0;
  fStack_dc = fStack_204;
  local_24c = *piVar21;
  if ((pnVar22 != (nk_context *)0x0) && (local_24c == 0)) {
    r.y = fStack_f4;
    r.x = local_f8;
    r.h = fStack_e4;
    r.w = local_e8;
    local_1b8 = (int *)CONCAT44(fStack_194,local_198 + (float)local_158._0_4_);
    uStack_1b0 = uStack_190;
    uStack_1ac = fStack_18c;
    fStack_84 = fStack_134;
    uStack_80 = fStack_130;
    uStack_7c = fStack_12c;
    local_88 = local_f8;
    iVar16 = nk_button_behavior(state,r,&pnVar22->input,NK_BUTTON_DEFAULT);
    iVar17 = 1;
    if (((iVar16 != 0) ||
        ((((fVar30 = (pnVar22->input).mouse.buttons[0].clicked_pos.x, local_198 <= fVar30 &&
           (fVar30 < (float)local_1b8)) &&
          (fVar31 = (pnVar22->input).mouse.buttons[0].clicked_pos.y, local_1a8 <= fVar31)) &&
         (((fVar31 < local_1a8 + local_108 && ((pnVar22->input).mouse.buttons[0].down == 1)) &&
          (iVar17 = 2, (pnVar22->input).mouse.buttons[0].clicked != 0)))))) ||
       ((((float)local_1b8 <= fVar30 && (fVar30 < (local_88 - (float)local_1b8) + (float)local_1b8))
        && ((fVar30 = (pnVar22->input).mouse.buttons[0].clicked_pos.y, (float)local_248 <= fVar30 &&
            (((fVar30 < (float)local_248 + local_208 &&
              ((pnVar22->input).mouse.buttons[0].down == 1)) &&
             (iVar17 = 2, (pnVar22->input).mouse.buttons[0].clicked != 0)))))))) {
      *piVar21 = iVar17;
    }
  }
  if (*piVar21 == 2) {
    if (pnVar22 == (nk_context *)0x0) {
      bVar27 = false;
    }
    else {
      bVar27 = (pnVar22->input).mouse.buttons[0].down != 0;
    }
    if (pnVar22 == (nk_context *)0x0) {
      bVar28 = false;
    }
    else {
      fVar30 = (pnVar22->input).mouse.buttons[0].clicked_pos.x;
      bVar28 = false;
      if ((local_228.x <= fVar30) && (bVar28 = false, fVar30 < local_118)) {
        fVar30 = (pnVar22->input).mouse.buttons[0].clicked_pos.y;
        bVar28 = false;
        if (((float)local_248 <= fVar30) && (fVar30 < (float)local_248 + local_208)) {
          bVar28 = (pnVar22->input).mouse.buttons[0].down == 1;
        }
      }
    }
    *state = *state & 2 | 4;
    if (((pnVar22 != (nk_context *)0x0) &&
        (fVar30 = (pnVar22->input).mouse.pos.x, local_228.x <= fVar30)) &&
       ((fVar30 < local_118 &&
        ((fVar30 = (pnVar22->input).mouse.pos.y, (float)local_248 <= fVar30 &&
         (fVar30 < (float)local_248 + local_208)))))) {
      *state = 0x12;
    }
    if ((bool)(bVar27 & bVar28)) {
      fVar30 = local_1e4 * (pnVar22->input).mouse.delta.x;
      nVar3 = variant->kind;
      if (nVar3 == NK_PROPERTY_DOUBLE) {
        dVar7 = (double)fVar30 + (variant->value).d;
        if ((variant->max_value).d <= dVar7) {
          dVar7 = (variant->max_value).d;
        }
        dVar8 = (variant->min_value).d;
        if ((variant->min_value).d <= dVar7) {
          dVar8 = dVar7;
        }
        (variant->value).d = dVar8;
      }
      else if (nVar3 == NK_PROPERTY_FLOAT) {
        fVar30 = fVar30 + (variant->value).f;
        if ((variant->max_value).f <= fVar30) {
          fVar30 = (variant->max_value).f;
        }
        fVar31 = (variant->min_value).f;
        if ((variant->min_value).f <= fVar30) {
          fVar31 = fVar30;
        }
        (variant->value).f = fVar31;
      }
      else if (nVar3 == NK_PROPERTY_INT) {
        iVar16 = (int)fVar30 + (variant->value).i;
        if ((variant->max_value).i <= iVar16) {
          iVar16 = (variant->max_value).i;
        }
        if (iVar16 <= (variant->min_value).i) {
          iVar16 = (variant->min_value).i;
        }
        (variant->value).i = iVar16;
      }
      *state = 0x22;
    }
    if ((((*state & 0x10) != 0) &&
        ((((uVar20 = 8, pnVar22 == (nk_context *)0x0 ||
           (fVar30 = (pnVar22->input).mouse.prev.x, fVar30 < local_228.x)) || (local_118 <= fVar30))
         || ((fVar30 = (pnVar22->input).mouse.prev.y, fVar30 < (float)local_248 ||
             ((float)local_248 + local_208 <= fVar30)))))) ||
       (((pnVar22 != (nk_context *)0x0 &&
         ((fVar30 = (pnVar22->input).mouse.prev.x, local_228.x <= fVar30 && (fVar30 < local_118))))
        && ((fVar30 = (pnVar22->input).mouse.prev.y, (float)local_248 <= fVar30 &&
            (uVar20 = 0x40, fVar30 < (float)local_248 + local_208)))))) {
      *state = *state | uVar20;
    }
    if ((*state & 0x20) == 0) {
      *piVar21 = 0;
    }
  }
  local_248._0_4_ = (float)local_248 + local_1e0;
  local_208 = local_208 * 0.5;
  b = &pnVar4->buffer;
  p_Var6 = (ctx->style).property.draw_begin;
  local_1b8 = piVar24;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var6)(b,(nk_handle)(ctx->style).property.userdata.ptr);
  }
  uStack_190 = fStack_194;
  if ((*state & 0x20) == 0) {
    if ((*state & 0x10) == 0) {
      pnVar26 = &(ctx->style).property;
      local_178.text = (ctx->style).property.label_normal;
    }
    else {
      pnVar26 = (nk_style_property *)&(ctx->style).property.hover;
      local_178.text = (ctx->style).property.label_hover;
    }
  }
  else {
    pnVar26 = (nk_style_property *)&(ctx->style).property.active;
    local_178.text = (ctx->style).property.label_active;
  }
  local_208 = (local_208 + (float)local_248) - (float)local_218._0_4_ * 0.5;
  fStack_194 = local_1a8;
  fStack_18c = fStack_1a4;
  uStack_150 = local_158._4_4_;
  local_158._4_4_ = local_108;
  fStack_14c = fStack_104;
  local_248 = b;
  local_120 = pnVar4;
  if ((pnVar26->normal).type == NK_STYLE_ITEM_IMAGE) {
    r_00.w = local_168;
    r_00.h = fStack_164;
    r_00.x = local_228.x;
    r_00.y = local_228.y;
    nk_draw_image(b,r_00,&(pnVar26->normal).data.image,(nk_color)0xffffffff);
    local_178.background.r = '\0';
    local_178.background.g = '\0';
    local_178.background.b = '\0';
    local_178.background.a = '\0';
  }
  else {
    local_178.background = (pnVar26->normal).data.color;
    rect.w = local_168;
    rect.h = fStack_164;
    rect.x = local_228.x;
    rect.y = local_228.y;
    nk_fill_rect(b,rect,(ctx->style).property.rounding,local_178.background);
    rect_00.w = local_168;
    rect_00.h = fStack_164;
    rect_00.x = local_228.x;
    rect_00.y = local_228.y;
    nk_stroke_rect(b,rect_00,(ctx->style).property.rounding,(ctx->style).property.border,
                   (pnVar26->normal).data.color);
  }
  auVar12 = _local_158;
  local_218._4_4_ = local_218._0_4_;
  local_218._8_4_ = local_218._0_4_;
  local_218._12_4_ = local_218._0_4_;
  uStack_140 = CONCAT44(fStack_204,local_148._4_4_);
  local_178.padding.x = 0.0;
  local_178.padding.y = 0.0;
  b_00.y = fStack_194;
  b_00.x = local_198;
  b_00.w = (float)local_158._0_4_;
  b_00.h = (float)local_158._4_4_;
  _local_158 = auVar12;
  local_148 = CONCAT44(local_208,(int)local_148);
  nk_widget_text(b,b_00,name,local_1dc,&local_178,0x12,pnVar25);
  behavior = local_1d8;
  p_Var6 = (ctx->style).property.draw_end;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var6)(b,(nk_handle)(ctx->style).property.userdata.ptr);
  }
  fStack_130 = fStack_134;
  auVar12 = local_218;
  fStack_134 = local_208;
  fStack_12c = fStack_204;
  bounds_00.w = (float)local_218._0_4_;
  bounds_00.h = (float)local_218._4_4_;
  bounds_00.x = (float)local_148;
  bounds_00.y = (float)local_148._4_4_;
  local_218 = auVar12;
  iVar16 = nk_do_button_symbol(state,b,bounds_00,(ctx->style).property.sym_left,behavior,
                               &(ctx->style).property.dec_button,&pnVar22->input,pnVar25);
  auVar12 = local_218;
  if (iVar16 != 0) {
    nVar3 = variant->kind;
    if (nVar3 == NK_PROPERTY_DOUBLE) {
      dVar7 = (variant->value).d - (variant->step).d;
      if ((variant->max_value).d <= dVar7) {
        dVar7 = (variant->max_value).d;
      }
      dVar8 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar7) {
        dVar8 = dVar7;
      }
      (variant->value).d = dVar8;
    }
    else if (nVar3 == NK_PROPERTY_FLOAT) {
      fVar30 = (variant->value).f - (variant->step).f;
      if ((variant->max_value).f <= fVar30) {
        fVar30 = (variant->max_value).f;
      }
      fVar31 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar30) {
        fVar31 = fVar30;
      }
      (variant->value).f = fVar31;
    }
    else if (nVar3 == NK_PROPERTY_INT) {
      iVar16 = (variant->value).i - (variant->step).i;
      if ((variant->max_value).i <= iVar16) {
        iVar16 = (variant->max_value).i;
      }
      if (iVar16 <= (variant->min_value).i) {
        iVar16 = (variant->min_value).i;
      }
      (variant->value).i = iVar16;
    }
  }
  bounds_01.y = fStack_134;
  bounds_01.x = local_138;
  bounds_01.w = (float)local_218._0_4_;
  bounds_01.h = (float)local_218._4_4_;
  local_218 = auVar12;
  iVar16 = nk_do_button_symbol(state,b,bounds_01,(ctx->style).property.sym_right,behavior,
                               &(ctx->style).property.inc_button,&pnVar22->input,pnVar25);
  piVar11 = local_1b8;
  piVar24 = local_238;
  if (iVar16 != 0) {
    nVar3 = variant->kind;
    if (nVar3 == NK_PROPERTY_DOUBLE) {
      dVar7 = (variant->value).d + (variant->step).d;
      if ((variant->max_value).d <= dVar7) {
        dVar7 = (variant->max_value).d;
      }
      dVar8 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar7) {
        dVar8 = dVar7;
      }
      (variant->value).d = dVar8;
    }
    else if (nVar3 == NK_PROPERTY_FLOAT) {
      fVar30 = (variant->value).f + (variant->step).f;
      if ((variant->max_value).f <= fVar30) {
        fVar30 = (variant->max_value).f;
      }
      fVar31 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar30) {
        fVar31 = fVar30;
      }
      (variant->value).f = fVar31;
    }
    else if (nVar3 == NK_PROPERTY_INT) {
      iVar16 = (variant->step).i + (variant->value).i;
      if ((variant->max_value).i <= iVar16) {
        iVar16 = (variant->max_value).i;
      }
      if (iVar16 <= (variant->min_value).i) {
        iVar16 = (variant->min_value).i;
      }
      (variant->value).i = iVar16;
    }
  }
  local_128 = pnVar22;
  if ((local_24c == 1) || (*piVar21 != 1)) {
    uVar20 = (uint)(*piVar21 == 1);
    pcVar19 = local_180;
  }
  else {
    nk_memcopy(local_270,local_180,(long)*local_238);
    iVar16 = nk_utf_len(local_270,*piVar24);
    *local_230 = iVar16;
    *piVar11 = *piVar24;
    uVar20 = 0;
    local_238 = piVar11;
    pcVar19 = local_270;
  }
  pnVar22 = local_128;
  piVar14 = local_1f0;
  piVar13 = local_1f8;
  piVar11 = local_230;
  piVar24 = local_238;
  filter_00 = (nk_plugin_filter)(&PTR_nk_filter_decimal_0019dd00)[local_1d4];
  (ctx->text_edit).undo.undo_point = 0;
  (ctx->text_edit).undo.redo_point = 99;
  (ctx->text_edit).undo.undo_char_point = 0;
  (ctx->text_edit).undo.redo_char_point = 999;
  (ctx->text_edit).cursor = 0;
  (ctx->text_edit).select_start = 0;
  (ctx->text_edit).select_end = 0;
  (ctx->text_edit).mode = '\0';
  (ctx->text_edit).cursor_at_end_of_line = '\0';
  (ctx->text_edit).initialized = '\x01';
  (ctx->text_edit).has_preferred_x = '\0';
  (ctx->text_edit).preferred_x = 0.0;
  (ctx->text_edit).single_line = '\x01';
  (ctx->text_edit).filter = filter_00;
  (ctx->text_edit).scrollbar.x = 0.0;
  (ctx->text_edit).scrollbar.y = 0.0;
  local_218._0_4_ = uVar20;
  (ctx->text_edit).active = (uchar)uVar20;
  (ctx->text_edit).string.len = *local_238;
  iVar16 = *local_238;
  if (*local_230 < *local_238) {
    iVar16 = *local_230;
  }
  if (iVar16 < 1) {
    iVar16 = 0;
  }
  (ctx->text_edit).cursor = iVar16;
  iVar16 = *local_238;
  if (*local_1f8 < *local_238) {
    iVar16 = *local_1f8;
  }
  if (iVar16 < 1) {
    iVar16 = 0;
  }
  (ctx->text_edit).select_start = iVar16;
  iVar16 = *local_238;
  if (*local_1f0 < *local_238) {
    iVar16 = *local_1f0;
  }
  if (iVar16 < 1) {
    iVar16 = 0;
  }
  (ctx->text_edit).select_end = iVar16;
  (ctx->text_edit).string.buffer.allocated = (long)*local_238;
  (ctx->text_edit).string.buffer.memory.size = 0x40;
  (ctx->text_edit).string.buffer.memory.ptr = pcVar19;
  (ctx->text_edit).string.buffer.size = 0x40;
  (ctx->text_edit).mode = '\x01';
  in = (nk_context *)0x0;
  if (*piVar21 == 1) {
    in = local_128;
  }
  bounds_02.y = fStack_f4;
  bounds_02.x = local_f8;
  bounds_02.h = fStack_e4;
  bounds_02.w = local_e8;
  nk_do_edit(state,local_248,bounds_02,0x262,filter_00,&ctx->text_edit,&(ctx->style).property.edit,
             &in->input,local_258);
  *piVar24 = (ctx->text_edit).string.len;
  *piVar11 = (ctx->text_edit).cursor;
  *piVar13 = (ctx->text_edit).select_start;
  *piVar14 = (ctx->text_edit).select_end;
  pnVar4 = local_120;
  piVar24 = local_1b8;
  if ((pnVar22 != (nk_context *)0x0) && ((ctx->text_edit).active != '\0')) {
    uVar20 = (pnVar22->input).keyboard.keys[4].clicked;
    if ((pnVar22->input).keyboard.keys[4].down == 0) {
      if (1 < uVar20) goto LAB_0013d4be;
    }
    else if (uVar20 != 0) {
LAB_0013d4be:
      (ctx->text_edit).active = '\0';
    }
  }
  if ((local_218._0_4_ != 0) && ((ctx->text_edit).active == '\0')) {
    *piVar21 = 0;
    local_270[*piVar24] = '\0';
    nVar3 = variant->kind;
    if (nVar3 == NK_PROPERTY_INT) {
      iVar17 = nk_strtoi(local_270,(char **)0x0);
      iVar16 = (variant->max_value).i;
      if (iVar17 < (variant->max_value).i) {
        iVar16 = iVar17;
      }
      if (iVar16 <= (variant->min_value).i) {
        iVar16 = (variant->min_value).i;
      }
      (variant->value).i = iVar16;
    }
    else {
      if (nVar3 == NK_PROPERTY_FLOAT) {
        iVar16 = 0;
        pcVar19 = local_270;
        do {
          iVar17 = 1;
          if (*pcVar19 != '.') {
            if (*pcVar19 == '\0') goto LAB_0013d6b6;
            if (iVar16 == 3) goto LAB_0013d6b3;
            iVar17 = (uint)(0 < iVar16) + iVar16;
          }
          iVar16 = iVar17;
          pcVar19 = pcVar19 + 1;
        } while( true );
      }
      if (nVar3 == NK_PROPERTY_DOUBLE) {
        iVar16 = 0;
        pcVar19 = local_270;
        do {
          iVar17 = 1;
          if (*pcVar19 != '.') {
            if (*pcVar19 == '\0') goto LAB_0013d6eb;
            if (iVar16 == 3) goto LAB_0013d6e8;
            iVar17 = (uint)(0 < iVar16) + iVar16;
          }
          iVar16 = iVar17;
          pcVar19 = pcVar19 + 1;
        } while( true );
      }
    }
  }
LAB_0013d4f1:
  if (((pnVar22 != (nk_context *)0x0) && (*piVar21 != 0)) && ((pnVar4->property).active == 0)) {
    (pnVar4->property).active = 1;
    nk_memcopy((pnVar4->property).buffer,local_270,(long)*piVar24);
    (pnVar4->property).length = *piVar24;
    (pnVar4->property).cursor = *local_230;
    (pnVar4->property).state = *piVar21;
    (pnVar4->property).name = local_1e8;
    (pnVar4->property).select_start = *local_1f8;
    (pnVar4->property).select_end = *local_1f0;
    if (*piVar21 == 2) {
      (ctx->input).mouse.grab = '\x01';
      (ctx->input).mouse.grabbed = '\x01';
    }
  }
  if (local_1d0 != 0 && *piVar21 == 0) {
    if (local_1d0 == 2) {
      (ctx->input).mouse.grab = '\0';
      (ctx->input).mouse.grabbed = '\0';
      (ctx->input).mouse.ungrab = '\x01';
    }
    (pnVar4->property).select_start = 0;
    (pnVar4->property).select_end = 0;
    (pnVar4->property).active = 0;
  }
  return;
LAB_0013cb11:
  local_c8[lVar18] = '\0';
LAB_0013cb22:
  local_25c = (int)lVar18;
LAB_0013cb26:
  local_238 = &local_25c;
  local_180 = local_c8;
  local_e8 = (*pnVar25->width)(pnVar25->userdata,pnVar25->height,local_180,local_25c);
  goto LAB_0013cb4f;
LAB_0013d6b3:
  *pcVar19 = '\0';
LAB_0013d6b6:
  dVar7 = nk_strtod(local_270,(char **)0x0);
  fVar30 = (float)dVar7;
  if ((variant->max_value).f <= (float)dVar7) {
    fVar30 = (variant->max_value).f;
  }
  fVar31 = (variant->min_value).f;
  if ((variant->min_value).f <= fVar30) {
    fVar31 = fVar30;
  }
  (variant->value).f = fVar31;
  goto LAB_0013d4f1;
LAB_0013d6e8:
  *pcVar19 = '\0';
LAB_0013d6eb:
  dVar7 = nk_strtod(local_270,(char **)0x0);
  iVar16 = SUB84(dVar7,0);
  uVar32 = (undefined4)((ulong)dVar7 >> 0x20);
  nVar1 = variant->max_value;
  if (nVar1.d <= dVar7) {
    iVar16 = nVar1.i;
    uVar32 = nVar1._4_4_;
  }
  nVar1 = variant->min_value;
  iVar17 = nVar1.i;
  uVar33 = nVar1._4_4_;
  if (nVar1.d <= (double)CONCAT44(uVar32,iVar16)) {
    iVar17 = iVar16;
    uVar33 = uVar32;
  }
  nVar1._4_4_ = uVar33;
  nVar1.i = iVar17;
  variant->value = nVar1;
  goto LAB_0013d4f1;
}

Assistant:

NK_LIB void
nk_property(struct nk_context *ctx, const char *name, struct nk_property_variant *variant,
    float inc_per_pixel, const enum nk_property_filter filter)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_input *in;
    const struct nk_style *style;

    struct nk_rect bounds;
    enum nk_widget_layout_states s;

    int *state = 0;
    nk_hash hash = 0;
    char *buffer = 0;
    int *len = 0;
    int *cursor = 0;
    int *select_begin = 0;
    int *select_end = 0;
    int old_state;

    char dummy_buffer[NK_MAX_NUMBER_BUFFER];
    int dummy_state = NK_PROPERTY_DEFAULT;
    int dummy_length = 0;
    int dummy_cursor = 0;
    int dummy_select_begin = 0;
    int dummy_select_end = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    s = nk_widget(&bounds, ctx);
    if (!s) return;

    /* calculate hash from name */
    if (name[0] == '#') {
        hash = nk_murmur_hash(name, (int)nk_strlen(name), win->property.seq++);
        name++; /* special number hash */
    } else hash = nk_murmur_hash(name, (int)nk_strlen(name), 42);

    /* check if property is currently hot item */
    if (win->property.active && hash == win->property.name) {
        buffer = win->property.buffer;
        len = &win->property.length;
        cursor = &win->property.cursor;
        state = &win->property.state;
        select_begin = &win->property.select_start;
        select_end = &win->property.select_end;
    } else {
        buffer = dummy_buffer;
        len = &dummy_length;
        cursor = &dummy_cursor;
        state = &dummy_state;
        select_begin =  &dummy_select_begin;
        select_end = &dummy_select_end;
    }

    /* execute property widget */
    old_state = *state;
    ctx->text_edit.clip = ctx->clip;
    in = ((s == NK_WIDGET_ROM && !win->property.active) ||
        layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    nk_do_property(&ctx->last_widget_state, &win->buffer, bounds, name,
        variant, inc_per_pixel, buffer, len, state, cursor, select_begin,
        select_end, &style->property, filter, in, style->font, &ctx->text_edit,
        ctx->button_behavior);

    if (in && *state != NK_PROPERTY_DEFAULT && !win->property.active) {
        /* current property is now hot */
        win->property.active = 1;
        NK_MEMCPY(win->property.buffer, buffer, (nk_size)*len);
        win->property.length = *len;
        win->property.cursor = *cursor;
        win->property.state = *state;
        win->property.name = hash;
        win->property.select_start = *select_begin;
        win->property.select_end = *select_end;
        if (*state == NK_PROPERTY_DRAG) {
            ctx->input.mouse.grab = nk_true;
            ctx->input.mouse.grabbed = nk_true;
        }
    }
    /* check if previously active property is now inactive */
    if (*state == NK_PROPERTY_DEFAULT && old_state != NK_PROPERTY_DEFAULT) {
        if (old_state == NK_PROPERTY_DRAG) {
            ctx->input.mouse.grab = nk_false;
            ctx->input.mouse.grabbed = nk_false;
            ctx->input.mouse.ungrab = nk_true;
        }
        win->property.select_start = 0;
        win->property.select_end = 0;
        win->property.active = 0;
    }
}